

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk-c.cpp
# Opt level: O3

void duckdb_vector_ensure_validity_writable(duckdb_vector vector)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  TemplatedValidityData<unsigned_long> *pTVar3;
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  unsigned_long local_20;
  
  if (vector != (duckdb_vector)0x0) {
    duckdb::FlatVector::VerifyFlatVector((Vector *)vector);
    if (*(long *)(vector + 0x28) == 0) {
      local_20 = *(unsigned_long *)(vector + 0x40);
      duckdb::make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_38,&local_20);
      p_Var2 = p_Stack_30;
      uVar1 = local_38;
      local_38 = 0;
      p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(vector + 0x38);
      *(undefined8 *)(vector + 0x30) = uVar1;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(vector + 0x38) = p_Var2;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
      }
      pTVar3 = duckdb::shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                          (vector + 0x30));
      *(unsigned_long **)(vector + 0x28) =
           (pTVar3->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    }
  }
  return;
}

Assistant:

void duckdb_vector_ensure_validity_writable(duckdb_vector vector) {
	if (!vector) {
		return;
	}
	auto v = reinterpret_cast<duckdb::Vector *>(vector);
	auto &validity = duckdb::FlatVector::Validity(*v);
	validity.EnsureWritable();
}